

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O1

bool Jinx::Impl::StringToBoolean(String *inValue,bool *outValue)

{
  char *__s1;
  int iVar1;
  bool bVar2;
  
  if (outValue == (bool *)0x0) {
    __assert_fail("outValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxConversion.cpp"
                  ,0x46,"bool Jinx::Impl::StringToBoolean(const String &, bool *)");
  }
  __s1 = (inValue->_M_dataplus)._M_p;
  iVar1 = strcmp(__s1,"true");
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = strcmp(__s1,"false");
    bVar2 = false;
    if (iVar1 != 0) {
      return false;
    }
  }
  *outValue = bVar2;
  return true;
}

Assistant:

inline_t bool StringToBoolean(const String & inValue, bool * outValue)
	{
		assert(outValue);
		if (strcmp(inValue.c_str(), "true") == 0)
		{
			*outValue = true;
			return true;
		}
		else if (strcmp(inValue.c_str(), "false") == 0)
		{
			*outValue = false;
			return true;
		}
		return false;
	}